

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void freeenum(rnnenum *en)

{
  int local_14;
  int i;
  rnnenum *en_local;
  
  cleanupvarinfo(&en->varinfo);
  for (local_14 = 0; local_14 < en->valsnum; local_14 = local_14 + 1) {
    freevalue(en->vals[local_14]);
  }
  free(en->vals);
  free(en->fullname);
  free(en->name);
  free(en);
  return;
}

Assistant:

static void freeenum(struct rnnenum *en) {
	int i;
	cleanupvarinfo (&en->varinfo);

	for (i = 0; i < en->valsnum; i++)
		freevalue(en->vals[i]);
	free(en->vals);

	free(en->fullname);
	free(en->name);
	free(en);
}